

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

ecs_reader_t *
ecs_reader_init_w_iter
          (ecs_reader_t *__return_storage_ptr__,ecs_iter_t *it,ecs_iter_next_action_t next)

{
  ecs_filter_t local_38;
  ecs_world_t *local_20;
  ecs_world_t *world;
  ecs_iter_next_action_t next_local;
  ecs_iter_t *it_local;
  
  local_20 = it->world;
  __return_storage_ptr__->world = local_20;
  __return_storage_ptr__->state = EcsTableSegment;
  world = (ecs_world_t *)next;
  next_local = (ecs_iter_next_action_t)it;
  memcpy(&__return_storage_ptr__->data_iter,it,0xe0);
  __return_storage_ptr__->data_next = (ecs_iter_next_action_t)world;
  local_38.include = FLECS__TEcsComponent;
  local_38.exclude = (ecs_type_t)0x0;
  local_38.include_kind = EcsMatchDefault;
  local_38.exclude_kind = EcsMatchDefault;
  ecs_filter_iter(&__return_storage_ptr__->component_iter,local_20,&local_38);
  __return_storage_ptr__->component_next = ecs_filter_next;
  memset(&__return_storage_ptr__->table,0,0x68);
  return __return_storage_ptr__;
}

Assistant:

ecs_reader_t ecs_reader_init_w_iter(
    ecs_iter_t *it,
    ecs_iter_next_action_t next)
{
    ecs_world_t *world = it->world;

    ecs_reader_t result = {
        .world = world,
        .state = EcsTableSegment,
        .component_iter = ecs_filter_iter(world, &(ecs_filter_t){
            .include = ecs_type(EcsComponent)
        }),
        .component_next = ecs_filter_next,
        .data_iter = *it,
        .data_next = next
    };

    return result;
}